

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_same(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int rc;
  jx9_hashmap *p2;
  jx9_hashmap *p1;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (((1 < nArg) && (iVar1 = jx9_value_is_json_array(*apArg), iVar1 != 0)) &&
     (iVar1 = jx9_value_is_json_array(apArg[1]), iVar1 != 0)) {
    jx9_result_bool(pCtx,(uint)(((*apArg)->x).iVal == (apArg[1]->x).iVal));
    return 0;
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9_hashmap_same(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *p1, *p2;
	int rc;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing or invalid arguments, return FALSE*/
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the hashmaps */
	p1 = (jx9_hashmap *)apArg[0]->x.pOther;
	p2 = (jx9_hashmap *)apArg[1]->x.pOther;
	rc = (p1 == p2);
	/* Same instance? */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}